

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

unique_ptr<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>_> __thiscall
wallet::LegacyScriptPubKeyMan::GetMetadata(LegacyScriptPubKeyMan *this,CTxDestination *dest)

{
  undefined4 uVar1;
  _Rb_tree_color _Var2;
  undefined4 uVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  const_iterator cVar6;
  _func_int **pp_Var7;
  const_iterator cVar8;
  CTxDestination *in_RDX;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CScript scriptPubKey;
  CKeyID key_id;
  unique_lock<std::recursive_mutex> local_90;
  CScriptID local_7c;
  direct_or_indirect local_68;
  uint local_4c;
  CKeyID local_44;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._M_device =
       (mutex_type *)
       ((long)&dest[2].
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u + 0x20);
  local_90._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_90);
  GetKeyForDestination
            (&local_44,
             (SigningProvider *)
             ((long)&dest[1].
                     super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     ._M_u + 8),in_RDX);
  plVar5 = (long *)std::
                   __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<160u>::IsNull()const::_lambda(unsigned_char)_1_>>
                             (&local_44,&local_30);
  if (plVar5 != &local_30) {
    cVar6 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
            ::find((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                    *)((long)&dest[6].
                              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              ._M_u + 0x20),&local_44);
    if (cVar6._M_node !=
        (_Base_ptr)
        ((long)&dest[6].
                super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                .
                super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                ._M_u + 0x28U)) {
      pp_Var7 = (_func_int **)operator_new(0x70);
      uVar1 = *(undefined4 *)((long)&cVar6._M_node[1]._M_right + 4);
      _Var2 = cVar6._M_node[2]._M_color;
      uVar3 = *(undefined4 *)&cVar6._M_node[2].field_0x4;
      *(undefined4 *)pp_Var7 = *(undefined4 *)&cVar6._M_node[1]._M_right;
      *(undefined4 *)((long)pp_Var7 + 4) = uVar1;
      *(_Rb_tree_color *)(pp_Var7 + 1) = _Var2;
      *(undefined4 *)((long)pp_Var7 + 0xc) = uVar3;
      pp_Var7[2] = (_func_int *)(pp_Var7 + 4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var7 + 2),cVar6._M_node[2]._M_parent,
                 (long)&(cVar6._M_node[2]._M_parent)->_M_color +
                 (long)&(cVar6._M_node[2]._M_left)->_M_color);
      *(undefined4 *)(pp_Var7 + 8) = *(undefined4 *)&cVar6._M_node[3]._M_right;
      p_Var4 = cVar6._M_node[3]._M_left;
      pp_Var7[6] = (_func_int *)cVar6._M_node[3]._M_parent;
      pp_Var7[7] = (_func_int *)p_Var4;
      *(_Rb_tree_color *)(pp_Var7 + 9) = cVar6._M_node[4]._M_color;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(pp_Var7 + 10),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&cVar6._M_node[4]._M_parent)
      ;
      *(char *)(pp_Var7 + 0xd) = (char)cVar6._M_node[5]._M_color;
      (this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan = pp_Var7;
      goto LAB_00beef76;
    }
  }
  GetScriptForDestination((CScript *)&local_68.indirect_contents,in_RDX);
  CScriptID::CScriptID(&local_7c,(CScript *)&local_68.indirect_contents);
  cVar8 = std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
          ::find((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
                  *)(dest + 7),&local_7c);
  if (cVar8._M_node ==
      (_Base_ptr)
      ((long)&dest[7].
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u + 8U)) {
    (this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan = (_func_int **)0x0;
    pp_Var7 = (_func_int **)0x0;
  }
  else {
    pp_Var7 = (_func_int **)operator_new(0x70);
    uVar1 = *(undefined4 *)((long)&cVar8._M_node[1]._M_right + 4);
    _Var2 = cVar8._M_node[2]._M_color;
    uVar3 = *(undefined4 *)&cVar8._M_node[2].field_0x4;
    *(undefined4 *)pp_Var7 = *(undefined4 *)&cVar8._M_node[1]._M_right;
    *(undefined4 *)((long)pp_Var7 + 4) = uVar1;
    *(_Rb_tree_color *)(pp_Var7 + 1) = _Var2;
    *(undefined4 *)((long)pp_Var7 + 0xc) = uVar3;
    pp_Var7[2] = (_func_int *)(pp_Var7 + 4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var7 + 2),cVar8._M_node[2]._M_parent,
               (long)&(cVar8._M_node[2]._M_parent)->_M_color +
               (long)&(cVar8._M_node[2]._M_left)->_M_color);
    *(undefined4 *)(pp_Var7 + 8) = *(undefined4 *)&cVar8._M_node[3]._M_right;
    p_Var4 = cVar8._M_node[3]._M_left;
    pp_Var7[6] = (_func_int *)cVar8._M_node[3]._M_parent;
    pp_Var7[7] = (_func_int *)p_Var4;
    *(_Rb_tree_color *)(pp_Var7 + 9) = cVar8._M_node[4]._M_color;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(pp_Var7 + 10),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&cVar8._M_node[4]._M_parent);
    *(char *)(pp_Var7 + 0xd) = (char)cVar8._M_node[5]._M_color;
  }
  (this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan = pp_Var7;
  if (0x1c < local_4c) {
    free(local_68.indirect_contents.indirect);
    local_68.indirect_contents.indirect = (char *)0x0;
  }
LAB_00beef76:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
            )(__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CKeyMetadata> LegacyScriptPubKeyMan::GetMetadata(const CTxDestination& dest) const
{
    LOCK(cs_KeyStore);

    CKeyID key_id = GetKeyForDestination(*this, dest);
    if (!key_id.IsNull()) {
        auto it = mapKeyMetadata.find(key_id);
        if (it != mapKeyMetadata.end()) {
            return std::make_unique<CKeyMetadata>(it->second);
        }
    }

    CScript scriptPubKey = GetScriptForDestination(dest);
    auto it = m_script_metadata.find(CScriptID(scriptPubKey));
    if (it != m_script_metadata.end()) {
        return std::make_unique<CKeyMetadata>(it->second);
    }

    return nullptr;
}